

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2obs.cpp
# Opt level: O0

void PrintResults(CESkyCoord *input_icrs,CESkyCoord *observed_altaz,CESkyCoord *observed_icrs,
                 CEObserver *observer,CEDate *date)

{
  long *plVar1;
  CEObserver *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  double dVar2;
  undefined8 uVar3;
  CEDate local_268 [64];
  CEAngle local_228 [16];
  CEDate local_218 [64];
  CEAngle local_1d8 [16];
  CEDate local_1c8 [64];
  CEAngle local_188 [16];
  CEDate local_178 [64];
  CEAngle local_138 [16];
  CEDate local_128 [64];
  CEAngle local_e8 [16];
  CEDate local_d8 [64];
  CEAngle local_98 [32];
  CEDate local_78 [64];
  CEAngle local_38 [16];
  long *local_28;
  CEObserver *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  printf("\n");
  printf("******************************************\n");
  printf("* Results of ICRS -> Observed conversion *\n");
  printf("******************************************\n");
  printf("Observed Coordinates (output)\n");
  plVar1 = local_10;
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(local_78,dVar2,JD);
  (**(code **)(*plVar1 + 0x18))(local_38,plVar1,local_78);
  uVar3 = CEAngle::Deg();
  printf("    Azimuth        : %f deg\n",uVar3);
  CEAngle::~CEAngle(local_38);
  CEDate::~CEDate(local_78);
  plVar1 = local_10;
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(local_d8,dVar2,JD);
  (**(code **)(*plVar1 + 0x20))(local_98,plVar1,local_d8);
  uVar3 = CEAngle::Deg();
  printf("    Zenith         : %+f deg\n",uVar3);
  CEAngle::~CEAngle(local_98);
  CEDate::~CEDate(local_d8);
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(local_128,dVar2,JD);
  (**(code **)(*local_10 + 0x20))(local_e8,local_10,local_128);
  dVar2 = (double)CEAngle::Deg();
  printf("    Altitude       : %+f deg\n",90.0 - dVar2);
  CEAngle::~CEAngle(local_e8);
  CEDate::~CEDate(local_128);
  printf("ICRS Coordinates (input)\n");
  plVar1 = local_8;
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(local_178,dVar2,JD);
  (**(code **)(*plVar1 + 0x18))(local_138,plVar1,local_178);
  uVar3 = CEAngle::Deg();
  printf("    Right Ascension: %f deg\n",uVar3);
  CEAngle::~CEAngle(local_138);
  CEDate::~CEDate(local_178);
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(local_1c8,dVar2,JD);
  (**(code **)(*local_8 + 0x20))(local_188,local_8,local_1c8);
  uVar3 = CEAngle::Deg();
  printf("    Declination    : %+f deg\n",uVar3);
  CEAngle::~CEAngle(local_188);
  CEDate::~CEDate(local_1c8);
  (**(code **)(*local_28 + 0x20))();
  printf("    Julian Date    : %f\n");
  printf("Apparent ICRS Coordinates\n");
  plVar1 = local_18;
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(local_218,dVar2,JD);
  (**(code **)(*plVar1 + 0x18))(local_1d8,plVar1,local_218);
  uVar3 = CEAngle::Deg();
  printf("    Right Ascension: %f deg\n",uVar3);
  CEAngle::~CEAngle(local_1d8);
  CEDate::~CEDate(local_218);
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(local_268,dVar2,JD);
  (**(code **)(*local_18 + 0x20))(local_228,local_18,local_268);
  uVar3 = CEAngle::Deg();
  printf("    Declination    : %f deg\n",uVar3);
  CEAngle::~CEAngle(local_228);
  CEDate::~CEDate(local_268);
  printf("Observer Info\n");
  CEObserver::Longitude_Deg(local_20);
  printf("    Longitude      : %f deg\n");
  CEObserver::Latitude_Deg(local_20);
  printf("    Latitude       : %+f deg\n");
  CEObserver::Elevation_m(local_20);
  printf("    Elevation      : %f meters\n");
  CEObserver::Pressure_hPa(local_20);
  printf("    Pressure       : %f hPa\n");
  CEObserver::Temperature_C(local_20);
  printf("    Temperature    : %f Celsius\n");
  CEObserver::RelativeHumidity(local_20);
  printf("    Relative Humid.: %f\n");
  printf("\n");
  return;
}

Assistant:

void PrintResults(const CESkyCoord& input_icrs,
                  const CESkyCoord& observed_altaz,
                  const CESkyCoord& observed_icrs,
                  const CEObserver& observer,
                  const CEDate    & date)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of ICRS -> Observed conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("Observed Coordinates (output)\n") ;
    std::printf("    Azimuth        : %f deg\n", observed_altaz.XCoord().Deg()) ;
    std::printf("    Zenith         : %+f deg\n", observed_altaz.YCoord().Deg()) ;
    std::printf("    Altitude       : %+f deg\n", 90.0-observed_altaz.YCoord().Deg()) ;
    std::printf("ICRS Coordinates (input)\n") ;
    std::printf("    Right Ascension: %f deg\n", input_icrs.XCoord().Deg()) ;
    std::printf("    Declination    : %+f deg\n", input_icrs.YCoord().Deg()) ;
    std::printf("    Julian Date    : %f\n", date.JD()) ;
    std::printf("Apparent ICRS Coordinates\n");
    std::printf("    Right Ascension: %f deg\n", observed_icrs.XCoord().Deg());
    std::printf("    Declination    : %f deg\n", observed_icrs.YCoord().Deg());
    std::printf("Observer Info\n") ;
    std::printf("    Longitude      : %f deg\n", observer.Longitude_Deg()) ;
    std::printf("    Latitude       : %+f deg\n", observer.Latitude_Deg()) ;
    std::printf("    Elevation      : %f meters\n", observer.Elevation_m()) ;
    std::printf("    Pressure       : %f hPa\n", observer.Pressure_hPa()) ;
    std::printf("    Temperature    : %f Celsius\n", observer.Temperature_C()) ;
    std::printf("    Relative Humid.: %f\n", observer.RelativeHumidity()) ;
    std::printf("\n") ;
}